

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.h
# Opt level: O0

void __thiscall ASDCP::MXF::Preface::~Preface(Preface *this)

{
  Preface *this_local;
  
  ~Preface(this);
  operator_delete(this,0x260);
  return;
}

Assistant:

virtual ~Preface() {}